

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::interval_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  int64_t *piVar2;
  timestamp_t tVar3;
  interval_t right_00;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  piVar2 = (int64_t *)result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    right_00.micros = (int64_t)right->data;
    right_00._0_8_ = *(undefined8 *)(left->data + 8);
    tVar3 = AddOperator::Operation<duckdb::date_t,duckdb::interval_t,duckdb::timestamp_t>
                      ((AddOperator *)(ulong)*(uint *)right->data,
                       (date_t)(int32_t)*(undefined8 *)left->data,right_00);
    *piVar2 = tVar3.value;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}